

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashGrow(xmlHashTablePtr hash,uint size)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlHashEntry *__s;
  xmlHashEntry *local_50;
  xmlHashEntry *entry;
  uint i;
  uint oldsize;
  xmlHashEntry *table;
  xmlHashEntry *end;
  xmlHashEntry *oldend;
  xmlHashEntry *oldentry;
  uint size_local;
  xmlHashTablePtr hash_local;
  
  if ((ulong)size < 0x666666666666667) {
    __s = (xmlHashEntry *)(*xmlMalloc)((ulong)size * 0x28);
    if (__s == (xmlHashEntry *)0x0) {
      hash_local._4_4_ = -1;
    }
    else {
      memset(__s,0,(ulong)size * 0x28);
      uVar1 = hash->size;
      if (uVar1 != 0) {
        pxVar2 = hash->table;
        oldend = hash->table;
        while (oldend->hashValue != 0) {
          oldend = oldend + 1;
          if (pxVar2 + uVar1 <= oldend) {
            oldend = hash->table;
          }
        }
        for (entry._0_4_ = 0; (uint)entry < uVar1; entry._0_4_ = (uint)entry + 1) {
          if (oldend->hashValue != 0) {
            local_50 = __s + (oldend->hashValue & size - 1);
            while (local_50->hashValue != 0) {
              local_50 = local_50 + 1;
              if (__s + size <= local_50) {
                local_50 = __s;
              }
            }
            memcpy(local_50,oldend,0x28);
          }
          oldend = oldend + 1;
          if (pxVar2 + uVar1 <= oldend) {
            oldend = hash->table;
          }
        }
        (*xmlFree)(hash->table);
      }
      hash->table = __s;
      hash->size = size;
      hash_local._4_4_ = 0;
    }
  }
  else {
    hash_local._4_4_ = -1;
  }
  return hash_local._4_4_;
}

Assistant:

static int
xmlHashGrow(xmlHashTablePtr hash, unsigned size) {
    const xmlHashEntry *oldentry, *oldend, *end;
    xmlHashEntry *table;
    unsigned oldsize, i;

    /* Add 0 to avoid spurious -Wtype-limits warning on 64-bit GCC */
    if ((size_t) size + 0 > SIZE_MAX / sizeof(table[0]))
        return(-1);
    table = xmlMalloc(size * sizeof(table[0]));
    if (table == NULL)
        return(-1);
    memset(table, 0, size * sizeof(table[0]));

    oldsize = hash->size;
    if (oldsize == 0)
        goto done;

    oldend = &hash->table[oldsize];
    end = &table[size];

    /*
     * Robin Hood sorting order is maintained if we
     *
     * - compute hash indices with modulo
     * - resize by an integer factor
     * - start to copy from the beginning of a probe sequence
     */
    oldentry = hash->table;
    while (oldentry->hashValue != 0) {
        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    for (i = 0; i < oldsize; i++) {
        if (oldentry->hashValue != 0) {
            xmlHashEntry *entry = &table[oldentry->hashValue & (size - 1)];

            while (entry->hashValue != 0) {
                if (++entry >= end)
                    entry = table;
            }
            *entry = *oldentry;
        }

        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    xmlFree(hash->table);

done:
    hash->table = table;
    hash->size = size;

    return(0);
}